

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ether_common.c
# Opt level: O0

LispPTR check_sum(LispPTR *args)

{
  LispPTR local_2c;
  DLword *pDStack_28;
  int nwords;
  DLword *address;
  LispPTR checksum;
  LispPTR *args_local;
  
  pDStack_28 = NativeAligned2FromLAddr(*args);
  local_2c = args[1];
  if (args[2] == 0) {
    address._4_4_ = 0;
  }
  else {
    address._4_4_ = args[2] & 0xffff;
  }
  for (; 0xe0000 < (int)local_2c; local_2c = local_2c - 1) {
    address._4_4_ = address._4_4_ + *(ushort *)((ulong)pDStack_28 ^ 2);
    if (0xffff < address._4_4_) {
      address._4_4_ = (address._4_4_ & 0xffff) + 1;
    }
    if (address._4_4_ < 0x8000) {
      address._4_4_ = address._4_4_ << 1;
    }
    else {
      address._4_4_ = (address._4_4_ & 0x7fff) << 1 | 1;
    }
    pDStack_28 = pDStack_28 + 1;
  }
  if (address._4_4_ == 0xffff) {
    args_local._4_4_ = 0xe0000;
  }
  else {
    args_local._4_4_ = address._4_4_ | 0xe0000;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR check_sum(LispPTR *args)
{
  LispPTR checksum;
  DLword *address;
  int nwords;

  address = (DLword *)NativeAligned2FromLAddr(*args++);
  nwords = *args++;

  if (*args != NIL)
    checksum = (*args) & MASKWORD1;
  else
    checksum = 0;

  for (; nwords > (S_POSITIVE); address++, nwords--) {
    checksum = checksum + GETWORD(address);
    if (checksum > 0xffff) checksum = (checksum & 0xffff) + 1; /* add carry */

    if (checksum > 0x7fff) /* ROTATE LEFT 1 */
      checksum = ((checksum & 0x7fff) << 1) | 1;
    else
      checksum = checksum << 1;
  }

  if (checksum == MASKWORD1)
    return (S_POSITIVE); /* ret 0 */
  else
    return (S_POSITIVE | checksum);

}